

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::verifyTextureLevelParameterGreaterOrEqual
               (CallLogWrapper *gl,GLenum target,int level,GLenum pname,int refValue,QueryType type)

{
  bool bVar1;
  qpTestResult qVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_270;
  MessageBuilder local_260;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  ResultCollector result;
  QueriedState state;
  int local_28;
  QueryType type_local;
  int refValue_local;
  GLenum pname_local;
  int level_local;
  GLenum target_local;
  CallLogWrapper *gl_local;
  
  local_28 = refValue;
  type_local = pname;
  refValue_local = level;
  pname_local = target;
  _level_local = gl;
  deqp::gls::StateQueryUtil::QueriedState::QueriedState
            ((QueriedState *)((long)&result.m_message.field_2 + 8));
  pTVar3 = glu::CallLogWrapper::getLog(_level_local);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8," // ERROR: ",&local_c9);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_a8,pTVar3,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pTVar3 = glu::CallLogWrapper::getLog(_level_local);
  tcu::TestLog::operator<<(&local_260,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_260,(char (*) [11])"Verifying ");
  EVar5 = glu::getTextureLevelParameterStr(type_local);
  local_270.m_getName = EVar5.m_getName;
  local_270.m_value = EVar5.m_value;
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_270);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])0x2c2d409);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_28);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [12])" or greater");
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_260);
  deqp::gls::StateQueryUtil::queryTextureLevelState
            ((ResultCollector *)local_a8,_level_local,type,pname_local,refValue_local,type_local,
             (QueriedState *)((long)&result.m_message.field_2 + 8));
  bVar1 = deqp::gls::StateQueryUtil::QueriedState::isUndefined
                    ((QueriedState *)((long)&result.m_message.field_2 + 8));
  if (bVar1) {
    gl_local._7_1_ = false;
  }
  else {
    deqp::gls::StateQueryUtil::verifyIntegerMin
              ((ResultCollector *)local_a8,(QueriedState *)((long)&result.m_message.field_2 + 8),
               local_28);
    qVar2 = tcu::ResultCollector::getResult((ResultCollector *)local_a8);
    gl_local._7_1_ = qVar2 == QP_TEST_RESULT_PASS;
  }
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_a8);
  return (bool)(gl_local._7_1_ & 1);
}

Assistant:

static bool verifyTextureLevelParameterGreaterOrEqual (glu::CallLogWrapper& gl, glw::GLenum target, int level, glw::GLenum pname, int refValue, QueryType type)
{
	QueriedState			state;
	tcu::ResultCollector	result	(gl.getLog(), " // ERROR: ");

	gl.getLog() << tcu::TestLog::Message << "Verifying " << glu::getTextureLevelParameterStr(pname) << ", expecting " << refValue << " or greater" << tcu::TestLog::EndMessage;
	queryTextureLevelState(result, gl, type, target, level, pname, state);

	if (state.isUndefined())
		return false;

	verifyIntegerMin(result, state, refValue);

	return result.getResult() == QP_TEST_RESULT_PASS;
}